

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

bool __thiscall
wallet::CWallet::ImportScripts
          (CWallet *this,set<CScript,_std::less<CScript>,_std::allocator<CScript>_> scripts,
          int64_t timestamp)

{
  long lVar1;
  set<CScript,_std::less<CScript>,_std::allocator<CScript>_> scripts_00;
  LegacyScriptPubKeyMan *this_00;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff98;
  RecursiveMutex *pRVar2;
  bool bVar3;
  undefined1 in_stack_ffffffffffffffa9 [31];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = GetLegacyScriptPubKeyMan(this);
  if (this_00 == (LegacyScriptPubKeyMan *)0x0) {
    bVar3 = false;
  }
  else {
    pRVar2 = &(this_00->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore;
    bVar3 = false;
    std::unique_lock<std::recursive_mutex>::lock
              ((unique_lock<std::recursive_mutex> *)&stack0xffffffffffffffa0);
    std::
    _Rb_tree<CScript,_CScript,_std::_Identity<CScript>,_std::less<CScript>,_std::allocator<CScript>_>
    ::_Rb_tree((_Rb_tree<CScript,_CScript,_std::_Identity<CScript>,_std::less<CScript>,_std::allocator<CScript>_>
                *)&stack0xffffffffffffffb0,
               (_Rb_tree<CScript,_CScript,_std::_Identity<CScript>,_std::less<CScript>,_std::allocator<CScript>_>
                *)timestamp);
    scripts_00._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = pRVar2;
    scripts_00._M_t._M_impl._0_8_ = in_stack_ffffffffffffff98;
    scripts_00._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ = bVar3;
    scripts_00._M_t._M_impl.super__Rb_tree_header._9_31_ = in_stack_ffffffffffffffa9;
    bVar3 = LegacyScriptPubKeyMan::ImportScripts
                      (this_00,scripts_00,(int64_t)&stack0xffffffffffffffb0);
    std::
    _Rb_tree<CScript,_CScript,_std::_Identity<CScript>,_std::less<CScript>,_std::allocator<CScript>_>
    ::~_Rb_tree((_Rb_tree<CScript,_CScript,_std::_Identity<CScript>,_std::less<CScript>,_std::allocator<CScript>_>
                 *)&stack0xffffffffffffffb0);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&stack0xffffffffffffffa0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::ImportScripts(const std::set<CScript> scripts, int64_t timestamp)
{
    auto spk_man = GetLegacyScriptPubKeyMan();
    if (!spk_man) {
        return false;
    }
    LOCK(spk_man->cs_KeyStore);
    return spk_man->ImportScripts(scripts, timestamp);
}